

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-string-view.cc
# Opt level: O0

void __thiscall
string_view_operator_less_than_or_equal_Test::TestBody
          (string_view_operator_less_than_or_equal_Test *this)

{
  bool bVar1;
  char *pcVar2;
  char *in_R9;
  string local_150;
  AssertHelper local_130;
  Message local_128;
  string_view local_120;
  string_view local_110;
  bool local_f9;
  undefined1 local_f8 [8];
  AssertionResult gtest_ar__2;
  AssertHelper local_c8;
  Message local_c0;
  string_view local_b8;
  string_view local_a8;
  bool local_91;
  undefined1 local_90 [8];
  AssertionResult gtest_ar__1;
  string local_78;
  AssertHelper local_58;
  Message local_50;
  string_view local_48;
  string_view local_38;
  bool local_21;
  undefined1 local_20 [8];
  AssertionResult gtest_ar_;
  string_view_operator_less_than_or_equal_Test *this_local;
  
  gtest_ar_.message_.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this;
  wabt::string_view::string_view(&local_38,"abc");
  wabt::string_view::string_view(&local_48,"xyz");
  local_21 = wabt::operator<=(local_38,local_48);
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_20,&local_21,(type *)0x0)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_20);
  if (!bVar1) {
    testing::Message::Message(&local_50);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_78,(internal *)local_20,
               (AssertionResult *)"string_view(\"abc\") <= string_view(\"xyz\")","false","true",
               in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_58,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/test-string-view.cc"
               ,399,pcVar2);
    testing::internal::AssertHelper::operator=(&local_58,&local_50);
    testing::internal::AssertHelper::~AssertHelper(&local_58);
    std::__cxx11::string::~string((string *)&local_78);
    testing::Message::~Message(&local_50);
  }
  gtest_ar__1.message_.ptr_._5_3_ = 0;
  gtest_ar__1.message_.ptr_._4_1_ = !bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_20);
  if (gtest_ar__1.message_.ptr_._4_4_ == 0) {
    wabt::string_view::string_view(&local_a8,"later");
    wabt::string_view::string_view(&local_b8,"earlier");
    bVar1 = wabt::operator<=(local_a8,local_b8);
    local_91 = (bool)((bVar1 ^ 0xffU) & 1);
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)local_90,&local_91,(type *)0x0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_90);
    if (!bVar1) {
      testing::Message::Message(&local_c0);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar__2.message_,(internal *)local_90,
                 (AssertionResult *)"string_view(\"later\") <= string_view(\"earlier\")","true",
                 "false",in_R9);
      pcVar2 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_c8,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/test-string-view.cc"
                 ,400,pcVar2);
      testing::internal::AssertHelper::operator=(&local_c8,&local_c0);
      testing::internal::AssertHelper::~AssertHelper(&local_c8);
      std::__cxx11::string::~string((string *)&gtest_ar__2.message_);
      testing::Message::~Message(&local_c0);
    }
    gtest_ar__1.message_.ptr_._5_3_ = 0;
    gtest_ar__1.message_.ptr_._4_1_ = !bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_90);
    if (gtest_ar__1.message_.ptr_._4_4_ == 0) {
      wabt::string_view::string_view(&local_110,"one");
      wabt::string_view::string_view(&local_120,"one");
      local_f9 = wabt::operator<=(local_110,local_120);
      testing::AssertionResult::AssertionResult<bool>
                ((AssertionResult *)local_f8,&local_f9,(type *)0x0);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_f8);
      if (!bVar1) {
        testing::Message::Message(&local_128);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  (&local_150,(internal *)local_f8,
                   (AssertionResult *)"string_view(\"one\") <= string_view(\"one\")","false","true",
                   in_R9);
        pcVar2 = (char *)std::__cxx11::string::c_str();
        testing::internal::AssertHelper::AssertHelper
                  (&local_130,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/test-string-view.cc"
                   ,0x191,pcVar2);
        testing::internal::AssertHelper::operator=(&local_130,&local_128);
        testing::internal::AssertHelper::~AssertHelper(&local_130);
        std::__cxx11::string::~string((string *)&local_150);
        testing::Message::~Message(&local_128);
      }
      gtest_ar__1.message_.ptr_._5_3_ = 0;
      gtest_ar__1.message_.ptr_._4_1_ = !bVar1;
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_f8);
    }
  }
  return;
}

Assistant:

TEST(string_view, operator_less_than_or_equal) {
  ASSERT_TRUE(string_view("abc") <= string_view("xyz"));
  ASSERT_FALSE(string_view("later") <= string_view("earlier"));
  ASSERT_TRUE(string_view("one") <= string_view("one"));
}